

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O1

void __thiscall cmExtraEclipseCDT4Generator::Generate(cmExtraEclipseCDT4Generator *this)

{
  string *cDir;
  string *cSubdir;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this_00;
  size_t __n;
  bool bVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  uint minorVersion;
  uint majorVersion;
  string eclipseVersion;
  RegularExpression regex;
  string local_180;
  string local_160;
  string local_140;
  long *local_120 [2];
  long local_110 [2];
  undefined1 local_100 [88];
  char *local_a8;
  char *local_48;
  
  this_00 = (*(((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->LocalGenerators).
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_start)->Makefile;
  local_100._0_8_ = local_100 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"CMAKE_ECLIPSE_VERSION","");
  pcVar5 = cmMakefile::GetSafeDefinition(this_00,(string *)local_100);
  std::__cxx11::string::string((string *)local_120,pcVar5,(allocator *)&local_180);
  if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
    operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
  }
  local_48 = (char *)0x0;
  cmsys::RegularExpression::compile((RegularExpression *)local_100,".*([0-9]+\\.[0-9]+).*");
  bVar2 = cmsys::RegularExpression::find((RegularExpression *)local_100,(char *)local_120[0]);
  if (bVar2) {
    local_140._M_dataplus._M_p = local_140._M_dataplus._M_p & 0xffffffff00000000;
    local_160._M_dataplus._M_p = local_160._M_dataplus._M_p & 0xffffffff00000000;
    if ((char *)local_100._8_8_ == (char *)0x0) {
      local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
      local_180._M_string_length = 0;
      local_180.field_2._M_local_buf[0] = '\0';
    }
    else {
      local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,local_100._8_8_,local_a8)
      ;
    }
    iVar4 = __isoc99_sscanf(local_180._M_dataplus._M_p,"%u.%u",&local_140);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != &local_180.field_2) {
      operator_delete(local_180._M_dataplus._M_p,
                      CONCAT71(local_180.field_2._M_allocated_capacity._1_7_,
                               local_180.field_2._M_local_buf[0]) + 1);
    }
    if (iVar4 == 2) {
      iVar4 = (int)local_140._M_dataplus._M_p * 1000 + (int)local_160._M_dataplus._M_p;
      if (iVar4 < 0xbbe) {
        this->SupportsVirtualFolders = false;
        this->SupportsMachO64Parser = false;
      }
      if (iVar4 < 0xbbf) {
        this->SupportsGmakeErrorParser = false;
      }
    }
  }
  pcVar6 = cmMakefile::GetHomeDirectory(this_00);
  cDir = &this->HomeDirectory;
  pcVar5 = (char *)(this->HomeDirectory)._M_string_length;
  strlen(pcVar6);
  std::__cxx11::string::_M_replace((ulong)cDir,0,pcVar5,(ulong)pcVar6);
  pcVar6 = cmMakefile::GetHomeOutputDirectory(this_00);
  cSubdir = &this->HomeOutputDirectory;
  pcVar5 = (char *)(this->HomeOutputDirectory)._M_string_length;
  strlen(pcVar6);
  std::__cxx11::string::_M_replace((ulong)cSubdir,0,pcVar5,(ulong)pcVar6);
  paVar1 = &local_180.field_2;
  local_180._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_180,"CMAKE_ECLIPSE_GENERATE_LINKED_RESOURCES","");
  bVar2 = cmMakefile::IsOn(this_00,&local_180);
  this->GenerateLinkedResources = bVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != paVar1) {
    operator_delete(local_180._M_dataplus._M_p,
                    CONCAT71(local_180.field_2._M_allocated_capacity._1_7_,
                             local_180.field_2._M_local_buf[0]) + 1);
  }
  __n = (this->HomeDirectory)._M_string_length;
  bVar2 = true;
  if (__n == (this->HomeOutputDirectory)._M_string_length) {
    if (__n == 0) {
      bVar2 = false;
    }
    else {
      iVar4 = bcmp((cDir->_M_dataplus)._M_p,(cSubdir->_M_dataplus)._M_p,__n);
      bVar2 = iVar4 != 0;
    }
  }
  this->IsOutOfSourceBuild = bVar2;
  if (bVar2 == false) {
    bVar3 = false;
  }
  else {
    local_180._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_180,"CMAKE_ECLIPSE_GENERATE_SOURCE_PROJECT","");
    bVar3 = cmMakefile::IsOn(this_00,&local_180);
  }
  this->GenerateSourceProject = bVar3;
  if ((bVar2 != false) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != paVar1)) {
    operator_delete(local_180._M_dataplus._M_p,
                    CONCAT71(local_180.field_2._M_allocated_capacity._1_7_,
                             local_180.field_2._M_local_buf[0]) + 1);
  }
  if (this->GenerateSourceProject == false) {
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_140,"ECLIPSE_CDT4_GENERATE_SOURCE_PROJECT","");
    bVar2 = cmMakefile::IsOn(this_00,&local_140);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar2 = false;
  }
  if (bVar2 != false) {
    local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_160,
               "ECLIPSE_CDT4_GENERATE_SOURCE_PROJECT is set to TRUE, but this variable is not supported anymore since CMake 2.8.7.\nEnable CMAKE_ECLIPSE_GENERATE_SOURCE_PROJECT instead."
               ,"");
    cmMakefile::IssueMessage(this_00,WARNING,&local_160);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
  }
  bVar2 = cmsys::SystemTools::IsSubDirectory(cSubdir,cDir);
  if (bVar2) {
    local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_160,
               "The build directory is a subdirectory of the source directory.\nThis is not supported well by Eclipse. It is strongly recommended to use a build directory which is a sibling of the source directory."
               ,"");
    cmMakefile::IssueMessage(this_00,WARNING,&local_160);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
  }
  if (this->GenerateSourceProject == true) {
    CreateSourceProjectFile(this);
  }
  CreateProjectFile(this);
  CreateCProjectFile(this);
  if (local_48 != (char *)0x0) {
    operator_delete__(local_48);
  }
  if (local_120[0] != local_110) {
    operator_delete(local_120[0],local_110[0] + 1);
  }
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::Generate()
{
  const cmMakefile* mf
    = this->GlobalGenerator->GetLocalGenerators()[0]->GetMakefile();

  std::string eclipseVersion = mf->GetSafeDefinition("CMAKE_ECLIPSE_VERSION");
  cmsys::RegularExpression regex(".*([0-9]+\\.[0-9]+).*");
  if (regex.find(eclipseVersion.c_str()))
    {
    unsigned int majorVersion = 0;
    unsigned int minorVersion = 0;
    int res=sscanf(regex.match(1).c_str(), "%u.%u", &majorVersion,
                                                    &minorVersion);
    if (res == 2)
      {
      int version = majorVersion * 1000 + minorVersion;
      if (version < 3006) // 3.6 is Helios
        {
        this->SupportsVirtualFolders = false;
        this->SupportsMachO64Parser = false;
        }
      if (version < 3007) // 3.7 is Indigo
        {
        this->SupportsGmakeErrorParser = false;
        }
      }
    }

  // TODO: Decide if these are local or member variables
  this->HomeDirectory       = mf->GetHomeDirectory();
  this->HomeOutputDirectory = mf->GetHomeOutputDirectory();

  this->GenerateLinkedResources = mf->IsOn(
                                    "CMAKE_ECLIPSE_GENERATE_LINKED_RESOURCES");

  this->IsOutOfSourceBuild = (this->HomeDirectory!=this->HomeOutputDirectory);

  this->GenerateSourceProject = (this->IsOutOfSourceBuild &&
                            mf->IsOn("CMAKE_ECLIPSE_GENERATE_SOURCE_PROJECT"));

  if ((this->GenerateSourceProject == false)
    && (mf->IsOn("ECLIPSE_CDT4_GENERATE_SOURCE_PROJECT")))
    {
    mf->IssueMessage(cmake::WARNING,
              "ECLIPSE_CDT4_GENERATE_SOURCE_PROJECT is set to TRUE, "
              "but this variable is not supported anymore since CMake 2.8.7.\n"
              "Enable CMAKE_ECLIPSE_GENERATE_SOURCE_PROJECT instead.");
    }

  if (cmSystemTools::IsSubDirectory(this->HomeOutputDirectory,
                                    this->HomeDirectory))
    {
    mf->IssueMessage(cmake::WARNING, "The build directory is a subdirectory "
                     "of the source directory.\n"
                     "This is not supported well by Eclipse. It is strongly "
                     "recommended to use a build directory which is a "
                     "sibling of the source directory.");
    }

  // NOTE: This is not good, since it pollutes the source tree. However,
  //       Eclipse doesn't allow CVS/SVN to work when the .project is not in
  //       the cvs/svn root directory. Hence, this is provided as an option.
  if (this->GenerateSourceProject)
    {
    // create .project file in the source tree
    this->CreateSourceProjectFile();
    }

  // create a .project file
  this->CreateProjectFile();

  // create a .cproject file
  this->CreateCProjectFile();
}